

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.h
# Opt level: O2

__m256i * comp_avg(__m256i *data_ref_0,__m256i *res_unsigned,__m256i *wt,int use_dist_wtd_comp_avg)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  __m256i *in_RAX;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  
  alVar1 = *data_ref_0;
  alVar2 = *res_unsigned;
  if (use_dist_wtd_comp_avg != 0) {
    auVar4 = vpunpcklwd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
    auVar3 = vpunpckhwd_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar2);
    auVar4 = vpmaddwd_avx2(auVar4,(undefined1  [32])*wt);
    auVar3 = vpmaddwd_avx2(auVar3,(undefined1  [32])*wt);
    auVar5 = vpsrad_avx2(auVar4,4);
    auVar4 = vpsrad_avx2(auVar3,4);
    vpackssdw_avx2(auVar5,auVar4);
    return in_RAX;
  }
  auVar4 = vpaddw_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar1);
  vpsraw_avx2(auVar4,1);
  return in_RAX;
}

Assistant:

static inline __m128i comp_avg(const __m128i *const data_ref_0,
                               const __m128i *const res_unsigned,
                               const __m128i *const wt,
                               const int use_dist_wtd_avg) {
  __m128i res;
  if (use_dist_wtd_avg) {
    const __m128i data_lo = _mm_unpacklo_epi16(*data_ref_0, *res_unsigned);
    const __m128i data_hi = _mm_unpackhi_epi16(*data_ref_0, *res_unsigned);

    const __m128i wt_res_lo = _mm_madd_epi16(data_lo, *wt);
    const __m128i wt_res_hi = _mm_madd_epi16(data_hi, *wt);

    const __m128i res_lo = _mm_srai_epi32(wt_res_lo, DIST_PRECISION_BITS);
    const __m128i res_hi = _mm_srai_epi32(wt_res_hi, DIST_PRECISION_BITS);

    res = _mm_packs_epi32(res_lo, res_hi);
  } else {
    const __m128i wt_res = _mm_add_epi16(*data_ref_0, *res_unsigned);
    res = _mm_srai_epi16(wt_res, 1);
  }
  return res;
}